

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

Transform * __thiscall
entt::basic_registry<entt::entity>::pool_handler<Transform>::replace<Transform_const&>
          (pool_handler<Transform> *this,basic_registry<entt::entity> *registry,entity entt,
          Transform *args)

{
  object_type *poVar1;
  undefined1 local_40 [8];
  Transform component;
  Transform *args_local;
  entity entt_local;
  basic_registry<entt::entity> *registry_local;
  pool_handler<Transform> *this_local;
  
  local_40._0_4_ = (args->m_position).field_0;
  local_40._4_4_ = (args->m_position).field_1;
  component.m_position._0_8_ = *(undefined8 *)&(args->m_position).field_2;
  component.m_position.field_2 =
       *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&(args->m_scale).field_1;
  component.m_scale.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&(args->m_scale).field_2;
  component.m_scale._4_8_ = args;
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>::publish
            (&this->update,entt,registry,(Transform *)local_40);
  poVar1 = basic_storage<entt::entity,_Transform,_void>::get
                     ((basic_storage<entt::entity,_Transform,_void> *)this,entt);
  (poVar1->m_position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_40._0_4_;
  (poVar1->m_position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_40._4_4_;
  *(undefined8 *)&(poVar1->m_position).field_2 = component.m_position._0_8_;
  (poVar1->m_scale).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)component.m_position.field_2;
  (poVar1->m_scale).field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)component.m_scale.field_0;
  return poVar1;
}

Assistant:

decltype(auto) replace(basic_registry &registry, const Entity entt, Args &&... args) {
            if constexpr(std::is_empty_v<Component>) {
                ENTT_ASSERT((storage<Entity, Component>::has(entt)));
                update.publish(entt, registry, Component{});
                return Component{std::forward<Args>(args)...};
            } else {
                Component component{std::forward<Args>(args)...};
                update.publish(entt, registry, component);
                return (storage<Entity, Component>::get(entt) = std::move(component));
            }
        }